

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlDateElementSize(uint64 type)

{
  int32 iVar1;
  uint64 in_RDI;
  uint64 ebml_size;
  
  iVar1 = GetUIntSize(in_RDI);
  return (long)iVar1 + 9;
}

Assistant:

uint64 EbmlDateElementSize(uint64 type) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += kDateElementSize;

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}